

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O0

void __thiscall arangodb::velocypack::ArrayIterator::ArrayIterator(ArrayIterator *this,Slice slice)

{
  uint8_t h;
  ValueType VVar1;
  undefined8 uVar2;
  char *pcVar3;
  uint8_t *puVar4;
  ArrayIterator *in_RSI;
  Exception *in_RDI;
  uint8_t head;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_00000028;
  undefined4 in_stack_ffffffffffffffec;
  ExceptionType type;
  Exception *this_00;
  
  *(ArrayIterator **)in_RDI = in_RSI;
  *(undefined8 *)&in_RDI->_type = 0;
  in_RDI->_msg = (char *)0x0;
  *(undefined8 *)(in_RDI + 1) = 0;
  this_00 = in_RDI;
  h = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::head
                ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x124a72);
  type = CONCAT13(h,(int3)in_stack_ffffffffffffffec);
  VVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::type(h);
  if (VVar1 == Array) {
    pcVar3 = (char *)SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                     arrayLength(in_stack_00000028);
    in_RDI->_msg = pcVar3;
    puVar4 = first(in_RSI);
    *(uint8_t **)&in_RDI->_type = puVar4;
    return;
  }
  uVar2 = __cxa_allocate_exception(0x18);
  Exception::Exception(this_00,type,(char *)in_RDI);
  __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

explicit ArrayIterator(Slice slice)
      : _slice{slice}, _current{nullptr}, _size{0}, _position{0} {
    auto const head = slice.head();
    if (VELOCYPACK_UNLIKELY(slice.type(head) != ValueType::Array)) {
      throw Exception{Exception::InvalidValueType, "Expecting Array slice"};
    }
    _size = slice.arrayLength();
    _current = first();
  }